

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

bool __thiscall Jupiter::Timer::removeFromList(Timer *this)

{
  bool bVar1;
  reference ppTVar2;
  const_iterator local_30;
  _Self local_28;
  _Self local_20;
  iterator node;
  Timer *this_local;
  
  node._M_node = (_List_node_base *)this;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<Jupiter::Timer_*,_std::allocator<Jupiter::Timer_*>_>::begin
                 (&o_timers_abi_cxx11_);
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<Jupiter::Timer_*,_std::allocator<Jupiter::Timer_*>_>::end
                   (&o_timers_abi_cxx11_);
    bVar1 = std::operator==(&local_20,&local_28);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return false;
    }
    ppTVar2 = std::_List_iterator<Jupiter::Timer_*>::operator*(&local_20);
    if (*ppTVar2 == this) break;
    std::_List_iterator<Jupiter::Timer_*>::operator++(&local_20);
  }
  std::_List_const_iterator<Jupiter::Timer_*>::_List_const_iterator(&local_30,&local_20);
  std::__cxx11::list<Jupiter::Timer_*,_std::allocator<Jupiter::Timer_*>_>::erase
            (&o_timers_abi_cxx11_,local_30);
  return true;
}

Assistant:

bool Jupiter::Timer::removeFromList()
{
	for (auto node = o_timers.begin(); node != o_timers.end(); ++node)
	{
		if (*node == this)
		{
			o_timers.erase(node);
			return true;
		}
	}

	return false;
}